

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O0

ssize_t __thiscall
chatra::emb::io::ReadStandardFile::read(ReadStandardFile *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  UnsupportedOperationException *this_00;
  unsigned_long *puVar2;
  size_t sVar3;
  NativeException *this_01;
  int __fd_00;
  undefined4 in_register_00000034;
  size_t readBytes;
  void *local_20;
  size_t length_local;
  uint8_t *dest_local;
  ReadStandardFile *this_local;
  
  length_local = CONCAT44(in_register_00000034,__fd);
  local_20 = __buf;
  dest_local = (uint8_t *)this;
  if ((this->super_StandardFileCommon).fp == (FILE *)0x0) {
    this_00 = (UnsupportedOperationException *)__cxa_allocate_exception(0x28);
    memset(this_00,0,0x28);
    UnsupportedOperationException::UnsupportedOperationException(this_00);
    __cxa_throw(this_00,&UnsupportedOperationException::typeinfo,
                UnsupportedOperationException::~UnsupportedOperationException);
  }
  readBytes = io::StandardFileCommon::available(&this->super_StandardFileCommon);
  puVar2 = std::min<unsigned_long>((unsigned_long *)&local_20,&readBytes);
  local_20 = (void *)*puVar2;
  __fd_00 = 1;
  sVar3 = fread((void *)length_local,1,(size_t)local_20,(FILE *)(this->super_StandardFileCommon).fp)
  ;
  iVar1 = ferror((FILE *)(this->super_StandardFileCommon).fp);
  if (iVar1 != 0) {
    io::StandardFileCommon::close(&this->super_StandardFileCommon,__fd_00);
    this_01 = (NativeException *)__cxa_allocate_exception(0x28);
    memset(this_01,0,0x28);
    NativeException::NativeException(this_01);
    __cxa_throw(this_01,&NativeException::typeinfo,NativeException::~NativeException);
  }
  (this->super_StandardFileCommon).current = sVar3 + (this->super_StandardFileCommon).current;
  return sVar3;
}

Assistant:

size_t read(uint8_t* dest, size_t length) override {
		if (fp == nullptr)
			throw UnsupportedOperationException();

		length = std::min(length, available());
		auto readBytes = std::fread(dest, 1, length, fp);
		if (std::ferror(fp)) {
			close();
			throw NativeException();
		}
		current += readBytes;
		return readBytes;
	}